

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nap_comm.cpp
# Opt level: O0

void standard_communication<double>
               (vector<double,_std::allocator<double>_> *send_vals,
               vector<double,_std::allocator<double>_> *recv_vals,int tag,MPI_Datatype mpi_type,
               MPIX_Data *send_data,MPIX_Data *recv_data)

{
  value_type vVar1;
  value_type vVar2;
  undefined4 uVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  reference ppoVar7;
  ompi_request_t **ppoVar8;
  undefined8 in_RCX;
  undefined4 in_EDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  int *in_R8;
  int *in_R9;
  int i_1;
  int j;
  int i;
  vector<double,_std::allocator<double>_> buf;
  int idx;
  int end;
  int start;
  int proc;
  allocator_type *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  undefined8 uVar9;
  int local_78;
  value_type local_74;
  int local_70;
  vector<double,_std::allocator<double>_> local_58;
  int local_40;
  int local_3c;
  value_type local_38;
  value_type local_34;
  int *local_30;
  int *local_28;
  undefined8 local_20;
  undefined4 local_14;
  vector<double,_std::allocator<double>_> *local_10;
  vector<double,_std::allocator<double>_> *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<double>::allocator((allocator<double> *)0x15c6b9);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff40,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
             ,in_stack_ffffffffffffff30);
  std::allocator<double>::~allocator((allocator<double> *)0x15c6df);
  for (local_70 = 0; local_70 < *local_28; local_70 = local_70 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_28 + 2),(long)local_70);
    local_34 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_28 + 8),(long)local_70);
    local_38 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_28 + 8),(long)(local_70 + 1));
    local_3c = *pvVar5;
    for (local_74 = local_38; local_74 < local_3c; local_74 = local_74 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_28 + 0xe),(long)local_74);
      local_40 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_8,(long)local_40);
      vVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_74);
      *pvVar6 = vVar1;
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_38);
    uVar3 = local_14;
    uVar9 = local_20;
    vVar2 = local_34;
    iVar4 = local_3c - local_38;
    ppoVar7 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                        ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)
                         (local_28 + 0x14),(long)local_70);
    MPI_Isend(pvVar6,iVar4,uVar9,vVar2,uVar3,&ompi_mpi_comm_world,ppoVar7);
  }
  for (local_78 = 0; local_78 < *local_30; local_78 = local_78 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_30 + 2),(long)local_78);
    local_34 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_30 + 8),(long)local_78);
    local_38 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_30 + 8),(long)(local_78 + 1));
    local_3c = *pvVar5;
    in_stack_ffffffffffffff30 =
         (allocator_type *)
         std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_38);
    uVar3 = local_14;
    vVar2 = local_34;
    iVar4 = local_3c - local_38;
    uVar9 = local_20;
    ppoVar7 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                        ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)
                         (local_30 + 0x14),(long)local_78);
    MPI_Irecv(in_stack_ffffffffffffff30,iVar4,uVar9,vVar2,uVar3,&ompi_mpi_comm_world,ppoVar7);
  }
  if (*local_28 != 0) {
    iVar4 = *local_28;
    ppoVar8 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::data
                        ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x15ca15);
    MPI_Waitall(iVar4,ppoVar8,0);
  }
  if (*local_30 != 0) {
    iVar4 = *local_30;
    ppoVar8 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::data
                        ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x15ca4d);
    MPI_Waitall(iVar4,ppoVar8,0);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
  return;
}

Assistant:

void standard_communication(std::vector<T>& send_vals, 
        std::vector<T>& recv_vals, int tag, MPI_Datatype mpi_type, 
        MPIX_Data* send_data, MPIX_Data* recv_data)
{
    int proc, start, end, idx;
    std::vector<T> buf(send_data->size_msgs);

    for (int i = 0; i < send_data->num_msgs; i++)
    {
        proc = send_data->procs[i];
        start = send_data->indptr[i];
        end = send_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            idx = send_data->indices[j];
            buf[j] = send_vals[idx];
        }
        MPI_Isend(&(buf[start]), end - start, mpi_type, proc, tag,
                MPI_COMM_WORLD, &send_data->requests[i]);
    }

    for (int i = 0; i < recv_data->num_msgs; i++)
    {
        proc = recv_data->procs[i];
        start = recv_data->indptr[i];
        end = recv_data->indptr[i+1];
        MPI_Irecv(&recv_vals[start], end - start, mpi_type, proc, tag, 
                MPI_COMM_WORLD, &recv_data->requests[i]);
    }
    
    if (send_data->num_msgs)
    {
        MPI_Waitall(send_data->num_msgs, send_data->requests.data(), 
                MPI_STATUSES_IGNORE);
    }
    if (recv_data->num_msgs)
    {
        MPI_Waitall(recv_data->num_msgs, recv_data->requests.data(), 
                MPI_STATUSES_IGNORE);
    }
}